

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O0

char * hp_notify_format_str(char *fmt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  boolean ispercent;
  char *end;
  char *p;
  char *f;
  char *fmt_local;
  
  bVar1 = false;
  hp_notify_format_str::buf[0] = '\0';
  if (fmt == (char *)0x0) {
    fmt_local = (char *)0x0;
  }
  else {
    end = hp_notify_format_str::buf;
    for (p = fmt; iVar3 = prev_hp_notify, *p != '\0'; p = p + 1) {
      if (hp_notify_format_str::buf + 0x76 < end) {
        end = hp_notify_format_str::buf + 0x76;
      }
      if (bVar1) {
        switch(*p) {
        case 'H':
          iVar3 = uhp();
          iVar2 = uhpmax();
          if (iVar3 == iVar2) {
            snprintf(end,(size_t)(hp_notify_format_str::buf + (0x77 - (long)end)),"%s","max");
          }
          else {
            iVar3 = uhp();
            snprintf(end,(size_t)(hp_notify_format_str::buf + (0x77 - (long)end)),"%ld",(long)iVar3)
            ;
          }
          for (; *end != '\0'; end = end + 1) {
          }
          break;
        default:
          *end = *p;
          if (end < hp_notify_format_str::buf + 0x76) {
            end = end + 1;
          }
          break;
        case 'a':
          iVar3 = uhp();
          iVar3 = iVar3 - prev_hp_notify;
          if (iVar3 < 1) {
            iVar3 = -iVar3;
          }
          snprintf(end,(size_t)(hp_notify_format_str::buf + (0x77 - (long)end)),"%ld",(long)iVar3);
          for (; *end != '\0'; end = end + 1) {
          }
          break;
        case 'c':
          iVar2 = uhp();
          uVar4 = 0x2b;
          if (iVar2 < iVar3) {
            uVar4 = 0x2d;
          }
          snprintf(end,(size_t)(hp_notify_format_str::buf + (0x77 - (long)end)),"%c",uVar4);
          end = end + 1;
          break;
        case 'h':
          iVar3 = uhp();
          snprintf(end,(size_t)(hp_notify_format_str::buf + (0x77 - (long)end)),"%ld",(long)iVar3);
          for (; *end != '\0'; end = end + 1) {
          }
          break;
        case 'm':
          iVar3 = uhpmax();
          snprintf(end,(size_t)(hp_notify_format_str::buf + (0x77 - (long)end)),"%ld",(long)iVar3);
          for (; *end != '\0'; end = end + 1) {
          }
        }
        bVar1 = false;
      }
      else if (*p == '%') {
        bVar1 = true;
      }
      else {
        *end = *p;
        if (end < hp_notify_format_str::buf + 0x76) {
          end = end + 1;
        }
      }
    }
    *end = '\0';
    fmt_local = hp_notify_format_str::buf;
  }
  return fmt_local;
}

Assistant:

static char *hp_notify_format_str(const char *fmt)
{
    static char buf[128];
    const char *f;
    char *p, *end;
    boolean ispercent = FALSE;

    buf[0] = '\0';

    if (!fmt) return NULL;

    p = buf;
    end = buf + sizeof(buf) - 10;

    for (f = fmt; *f; f++) {
	/* Don't give snprintf() negative buffer lengths. */
	if (p > end) p = end;
	if (ispercent) {
	    switch (*f) {
		case 'a':
		    snprintf(p, end + 1 - p, "%ld",
			     (long)abs(uhp() - prev_hp_notify));
		    while (*p != '\0') p++;
		    break;
		case 'c':
		    snprintf(p, end + 1 - p, "%c",
			     (prev_hp_notify > uhp() ? '-' : '+'));
		    p++;
		    break;
		case 'm':
		    snprintf(p, end + 1 - p, "%ld", (long)uhpmax());
		    while (*p != '\0') p++;
		    break;
		case 'H':
		    if (uhp() == uhpmax())
			snprintf(p, end + 1 - p, "%s", "max");
		    else
			snprintf(p, end + 1 - p, "%ld", (long)uhp());
		    while (*p != '\0') p++;
		    break;
		case 'h':
		    snprintf(p, end + 1 - p, "%ld", (long)uhp());
		    while (*p != '\0') p++;
		    break;
		default:
		    *p = *f;
		    if (p < end) p++;
	    }
	    ispercent = FALSE;
	} else {
	    if (*f == '%') {
		ispercent = TRUE;
	    } else {
		*p = *f;
		if (p < end) p++;
	    }
	}
    }
    *p = '\0';

    return buf;
}